

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

size_t ZSTDMT_initCStream_advanced
                 (ZSTDMT_CCtx *mtctx,void *dict,size_t dictSize,ZSTD_parameters params,
                 unsigned_long_long pledgedSrcSize)

{
  ZSTD_CCtx_params params_00;
  ZSTD_parameters ZVar1;
  size_t sVar2;
  undefined8 local_148;
  undefined8 uStack_140;
  undefined8 uStack_138;
  undefined8 uStack_130;
  undefined8 local_128;
  undefined8 uStack_120;
  undefined8 uStack_118;
  undefined8 uStack_110;
  undefined8 local_108;
  undefined8 uStack_100;
  undefined8 uStack_f8;
  undefined8 uStack_f0;
  undefined8 uStack_e8;
  undefined8 uStack_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  void *pvStack_c0;
  undefined1 local_b8 [4];
  undefined1 auStack_b4 [4];
  ZSTD_CCtx_params cctxParams;
  unsigned_long_long pledgedSrcSize_local;
  size_t dictSize_local;
  void *dict_local;
  ZSTDMT_CCtx *mtctx_local;
  
  ZVar1 = params;
  cctxParams.customMem.opaque = (void *)pledgedSrcSize;
  memcpy(local_b8,&mtctx->params,0x90);
  auStack_b4 = params.cParams.windowLog;
  unique0x00012004 = params.cParams.chainLog;
  params.cParams._8_8_ = ZVar1.cParams._8_8_;
  cctxParams.cParams.windowLog = params.cParams.hashLog;
  cctxParams.cParams.chainLog = params.cParams.searchLog;
  params.cParams._16_8_ = ZVar1.cParams._16_8_;
  cctxParams.cParams.hashLog = params.cParams.minMatch;
  cctxParams.cParams.searchLog = params.cParams.targetLength;
  params.cParams.strategy = ZVar1.cParams.strategy;
  cctxParams.cParams.minMatch = params.cParams.strategy;
  params.fParams._0_8_ = ZVar1.fParams._0_8_;
  cctxParams.cParams.targetLength = params.fParams.contentSizeFlag;
  cctxParams.cParams.strategy = params.fParams.checksumFlag;
  params.fParams.noDictIDFlag = ZVar1.fParams.noDictIDFlag;
  cctxParams.fParams.contentSizeFlag = params.fParams.noDictIDFlag;
  memcpy(&local_148,local_b8,0x90);
  params_00.cParams.chainLog = (undefined4)uStack_140;
  params_00.cParams.hashLog = uStack_140._4_4_;
  params_00.format = (undefined4)local_148;
  params_00.cParams.windowLog = local_148._4_4_;
  params_00.cParams.searchLog = (undefined4)uStack_138;
  params_00.cParams.minMatch = uStack_138._4_4_;
  params_00.cParams.targetLength = (undefined4)uStack_130;
  params_00.cParams.strategy = uStack_130._4_4_;
  params_00.fParams.contentSizeFlag = (undefined4)local_128;
  params_00.fParams.checksumFlag = local_128._4_4_;
  params_00.fParams.noDictIDFlag = (undefined4)uStack_120;
  params_00.compressionLevel = uStack_120._4_4_;
  params_00._48_8_ = uStack_118;
  params_00.targetCBlockSize = uStack_110;
  params_00.srcSizeHint = (undefined4)local_108;
  params_00.attachDictPref = local_108._4_4_;
  params_00.literalCompressionMode = (undefined4)uStack_100;
  params_00.nbWorkers = uStack_100._4_4_;
  params_00.jobSize = uStack_f8;
  params_00.overlapLog = (undefined4)uStack_f0;
  params_00.rsyncable = uStack_f0._4_4_;
  params_00.ldmParams.enableLdm = (undefined4)uStack_e8;
  params_00.ldmParams.hashLog = uStack_e8._4_4_;
  params_00.ldmParams.bucketSizeLog = (undefined4)uStack_e0;
  params_00.ldmParams.minMatchLength = uStack_e0._4_4_;
  params_00.ldmParams.hashRateLog = (undefined4)local_d8;
  params_00.ldmParams.windowLog = local_d8._4_4_;
  params_00.customMem.customAlloc = (ZSTD_allocFunction)uStack_d0;
  params_00.customMem.customFree = (ZSTD_freeFunction)uStack_c8;
  params_00.customMem.opaque = pvStack_c0;
  sVar2 = ZSTDMT_initCStream_internal
                    (mtctx,dict,dictSize,ZSTD_dct_auto,(ZSTD_CDict *)0x0,params_00,
                     (unsigned_long_long)cctxParams.customMem.opaque);
  return sVar2;
}

Assistant:

size_t ZSTDMT_initCStream_advanced(ZSTDMT_CCtx* mtctx,
                             const void* dict, size_t dictSize,
                                   ZSTD_parameters params,
                                   unsigned long long pledgedSrcSize)
{
    ZSTD_CCtx_params cctxParams = mtctx->params;  /* retrieve sticky params */
    DEBUGLOG(4, "ZSTDMT_initCStream_advanced (pledgedSrcSize=%u)", (U32)pledgedSrcSize);
    cctxParams.cParams = params.cParams;
    cctxParams.fParams = params.fParams;
    return ZSTDMT_initCStream_internal(mtctx, dict, dictSize, ZSTD_dct_auto, NULL,
                                       cctxParams, pledgedSrcSize);
}